

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void cp_reg_check_reset(gpointer key,gpointer value,gpointer opaque)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t newvalue;
  uint64_t oldvalue;
  ARMCPU_conflict *cpu;
  ARMCPRegInfo_conflict *ri;
  gpointer opaque_local;
  gpointer value_local;
  gpointer key_local;
  
  if ((*(uint *)((long)value + 0x14) & 0xa1) == 0) {
    uVar1 = read_raw_cp_reg_aarch64
                      ((CPUARMState_conflict *)((long)opaque + 0xa350),
                       (ARMCPRegInfo_conflict *)value);
    cp_reg_reset(key,value,opaque);
    uVar2 = read_raw_cp_reg_aarch64
                      ((CPUARMState_conflict *)((long)opaque + 0xa350),
                       (ARMCPRegInfo_conflict *)value);
    if (uVar1 != uVar2) {
      __assert_fail("oldvalue == newvalue",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/cpu.c"
                    ,0x92,"void cp_reg_check_reset(gpointer, gpointer, gpointer)");
    }
  }
  return;
}

Assistant:

static void cp_reg_check_reset(gpointer key, gpointer value,  gpointer opaque)
{
    /* Purely an assertion check: we've already done reset once,
     * so now check that running the reset for the cpreg doesn't
     * change its value. This traps bugs where two different cpregs
     * both try to reset the same state field but to different values.
     */
    ARMCPRegInfo *ri = value;
#ifndef NDEBUG
    ARMCPU *cpu = opaque;
    uint64_t oldvalue, newvalue;
#endif

    if (ri->type & (ARM_CP_SPECIAL | ARM_CP_ALIAS | ARM_CP_NO_RAW)) {
        return;
    }

#ifndef NDEBUG
    oldvalue = read_raw_cp_reg(&cpu->env, ri);
#endif
    cp_reg_reset(key, value, opaque);
#ifndef NDEBUG
    newvalue = read_raw_cp_reg(&cpu->env, ri);
    assert(oldvalue == newvalue);
#endif
}